

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  Nonnull<const_char_*> pcVar1;
  unsigned_long v2;
  ulong v1;
  
  v1 = (ulong)count;
  v2 = this->size_ - this->available_;
  if (v2 < v1) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,v2,"static_cast<size_t>(count) <= size_ - available_");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    this->available_ = this->available_ + v1;
    this->bytes_remaining_ = this->bytes_remaining_ + v1;
    return;
  }
  BackUp();
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}